

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::LSTM_x86_fma::create_pipeline_int8(LSTM_x86_fma *this,Option *opt)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  byte *in_RSI;
  long in_RDI;
  int size;
  int num_directions;
  Mat *in_stack_00000380;
  Mat *in_stack_00000388;
  Mat *in_stack_00000390;
  Mat *in_stack_00000398;
  Mat *in_stack_000003a0;
  Mat *in_stack_000003a8;
  Mat *in_stack_00000b60;
  Mat *in_stack_00000b68;
  int in_stack_00000b70;
  int in_stack_00000b78;
  int in_stack_00000b80;
  int in_stack_00000b88;
  Option *in_stack_00000b90;
  
  lstm_transform_weight_int8
            (in_stack_000003a8,in_stack_000003a0,in_stack_00000398,in_stack_00000390,
             in_stack_00000388,in_stack_00000380,in_stack_00000b60,in_stack_00000b68,
             in_stack_00000b70,in_stack_00000b78,in_stack_00000b80,in_stack_00000b88,
             in_stack_00000b90);
  if ((*in_RSI & 1) != 0) {
    puVar3 = (undefined8 *)(in_RDI + 0x130);
    if (*(long *)(in_RDI + 0x138) != 0) {
      piVar2 = *(int **)(in_RDI + 0x138);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x150) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    puVar3 = (undefined8 *)(in_RDI + 0x178);
    if (*(long *)(in_RDI + 0x180) != 0) {
      piVar2 = *(int **)(in_RDI + 0x180);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x198) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x198) + 0x18))(*(long **)(in_RDI + 0x198),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0x188) = 0;
    *(undefined4 *)(in_RDI + 400) = 0;
    *(undefined4 *)(in_RDI + 0x1a0) = 0;
    *(undefined4 *)(in_RDI + 0x1a4) = 0;
    *(undefined4 *)(in_RDI + 0x1a8) = 0;
    *(undefined4 *)(in_RDI + 0x1ac) = 0;
    *(undefined4 *)(in_RDI + 0x1b0) = 0;
    *(undefined8 *)(in_RDI + 0x1b8) = 0;
    *(undefined8 *)(in_RDI + 0x180) = 0;
    puVar3 = (undefined8 *)(in_RDI + 0xe8);
    if (*(long *)(in_RDI + 0xf0) != 0) {
      piVar2 = *(int **)(in_RDI + 0xf0);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x108) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))(*(long **)(in_RDI + 0x108),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x114) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0x11c) = 0;
    *(undefined4 *)(in_RDI + 0x120) = 0;
    *(undefined8 *)(in_RDI + 0x128) = 0;
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    puVar3 = (undefined8 *)(in_RDI + 0x250);
    if (*(long *)(in_RDI + 600) != 0) {
      piVar2 = *(int **)(in_RDI + 600);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x270) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x270) + 0x18))(*(long **)(in_RDI + 0x270),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0x260) = 0;
    *(undefined4 *)(in_RDI + 0x268) = 0;
    *(undefined4 *)(in_RDI + 0x278) = 0;
    *(undefined4 *)(in_RDI + 0x27c) = 0;
    *(undefined4 *)(in_RDI + 0x280) = 0;
    *(undefined4 *)(in_RDI + 0x284) = 0;
    *(undefined4 *)(in_RDI + 0x288) = 0;
    *(undefined8 *)(in_RDI + 0x290) = 0;
    *(undefined8 *)(in_RDI + 600) = 0;
    puVar3 = (undefined8 *)(in_RDI + 0x208);
    if (*(long *)(in_RDI + 0x210) != 0) {
      piVar2 = *(int **)(in_RDI + 0x210);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x228) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x228) + 0x18))(*(long **)(in_RDI + 0x228),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0x218) = 0;
    *(undefined4 *)(in_RDI + 0x220) = 0;
    *(undefined4 *)(in_RDI + 0x230) = 0;
    *(undefined4 *)(in_RDI + 0x234) = 0;
    *(undefined4 *)(in_RDI + 0x238) = 0;
    *(undefined4 *)(in_RDI + 0x23c) = 0;
    *(undefined4 *)(in_RDI + 0x240) = 0;
    *(undefined8 *)(in_RDI + 0x248) = 0;
    *(undefined8 *)(in_RDI + 0x210) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_fma::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}